

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O3

int __thiscall QtMWidgets::PageControlPrivate::init(PageControlPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int iVar2;
  long *plVar3;
  double dVar4;
  QColor QVar5;
  QStyleOption opt;
  QStyleOption local_50 [40];
  undefined1 local_28 [24];
  
  QStyleOption::QStyleOption(local_50,1,0);
  QStyleOption::initFrom((QWidget *)local_50);
  plVar3 = (long *)QPalette::brush((ColorGroup)local_28,Dark);
  uVar1 = *(undefined8 *)(*plVar3 + 8);
  *(undefined8 *)((long)&(this->currentPageIndicatorColor).ct + 2) = *(undefined8 *)(*plVar3 + 0xe);
  *(undefined8 *)&this->currentPageIndicatorColor = uVar1;
  QVar5 = lighterColor(&this->currentPageIndicatorColor,0x4b);
  *(long *)&this->pageIndicatorColor = QVar5._0_8_;
  *(int *)((long)&(this->pageIndicatorColor).ct + 4) = QVar5.ct._4_4_;
  (this->pageIndicatorColor).ct.argb.pad = QVar5.ct._8_2_;
  iVar2 = FingerGeometry::width();
  dVar4 = (double)iVar2 * 0.3 * 0.5;
  iVar2 = (int)dVar4;
  this->radius = iVar2;
  this->smallRadius = (int)((double)(int)dVar4 * 0.75);
  this->buttonSize = iVar2 * 3;
  iVar2 = QStyleOption::~QStyleOption(local_50);
  return iVar2;
}

Assistant:

void
PageControlPrivate::init()
{
	QStyleOption opt;
	opt.initFrom( q );

	currentPageIndicatorColor = opt.palette.color( QPalette::Highlight );
	pageIndicatorColor = lighterColor( currentPageIndicatorColor, 75 );

	radius = FingerGeometry::width() * 0.3 / 2;

	smallRadius = radius * 0.75;

	buttonSize = radius * 3;
}